

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orthogonal_states_test.cpp
# Opt level: O0

void __thiscall
afsm::test::OrthogonalRegions_Simple_Test::TestBody(OrthogonalRegions_Simple_Test *this)

{
  bool bVar1;
  event_process_result eVar2;
  char *pcVar3;
  char *in_R9;
  string local_750;
  AssertHelper local_730;
  Message local_728;
  bool local_719;
  undefined1 local_718 [8];
  AssertionResult gtest_ar__19;
  AssertHelper local_6e8;
  Message local_6e0;
  bool local_6d1;
  undefined1 local_6d0 [8];
  AssertionResult gtest_ar__18;
  AssertHelper local_6a0;
  Message local_698;
  bool local_689;
  undefined1 local_688 [8];
  AssertionResult gtest_ar__17;
  AssertHelper local_658;
  Message local_650;
  bool local_641;
  undefined1 local_640 [8];
  AssertionResult gtest_ar__16;
  AssertHelper local_610;
  Message local_608;
  bool local_5f9;
  undefined1 local_5f8 [8];
  AssertionResult gtest_ar__15;
  AssertHelper local_5c8;
  Message local_5c0;
  error local_5b2;
  bool local_5b1;
  undefined1 local_5b0 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_580;
  Message local_578;
  do_work local_56a;
  bool local_569;
  undefined1 local_568 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_538;
  Message local_530;
  bool local_521;
  undefined1 local_520 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_4f0;
  Message local_4e8;
  bool local_4d9;
  undefined1 local_4d8 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_4a8;
  Message local_4a0;
  bool local_491;
  undefined1 local_490 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_460;
  Message local_458;
  bool local_449;
  undefined1 local_448 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_418;
  Message local_410;
  bool local_401;
  undefined1 local_400 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_3d0;
  Message local_3c8;
  error local_3ba;
  bool local_3b9;
  undefined1 local_3b8 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_388;
  Message local_380;
  do_work local_372;
  bool local_371;
  undefined1 local_370 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_340;
  Message local_338;
  bool local_329;
  undefined1 local_328 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_2f8;
  Message local_2f0;
  bool local_2e1;
  undefined1 local_2e0 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_2b0;
  Message local_2a8;
  bool local_299;
  undefined1 local_298 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_268;
  Message local_260;
  bool local_251;
  undefined1 local_250 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_220;
  Message local_218;
  bool local_209;
  undefined1 local_208 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_1d8;
  Message local_1d0 [3];
  power_on local_1b2;
  bool local_1b1;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_;
  ortho_fsm fsm;
  OrthogonalRegions_Simple_Test *this_local;
  
  state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>::
  state_machine((state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>
                 *)&gtest_ar_.message_);
  eVar2 = state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>
          ::process_event<afsm::test::events::power_on>
                    ((state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>
                      *)&gtest_ar_.message_,&local_1b2);
  local_1b1 = actions::done(eVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1b0,&local_1b1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar1) {
    testing::Message::Message(local_1d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_1b0,
               (AssertionResult *)"done(fsm.process_event(events::power_on{}))","false","true",in_R9
              );
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/orthogonal_states_test.cpp"
               ,0x52,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1d8,local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  local_209 = detail::
              state_machine_base_impl<afsm::test::ortho_sm_def,_afsm::none,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
              ::is_in_state<afsm::test::ortho_sm_def::on>
                        ((state_machine_base_impl<afsm::test::ortho_sm_def,_afsm::none,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
                          *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_208,&local_209,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
  if (!bVar1) {
    testing::Message::Message(&local_218);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_208,
               (AssertionResult *)"fsm.is_in_state<ortho_fsm::on>()","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/orthogonal_states_test.cpp"
               ,0x53,pcVar3);
    testing::internal::AssertHelper::operator=(&local_220,&local_218);
    testing::internal::AssertHelper::~AssertHelper(&local_220);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_218);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
  local_251 = detail::
              state_machine_base_impl<afsm::test::ortho_sm_def,_afsm::none,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
              ::is_in_state<afsm::test::ortho_sm_def::on::work>
                        ((state_machine_base_impl<afsm::test::ortho_sm_def,_afsm::none,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
                          *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_250,&local_251,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
  if (!bVar1) {
    testing::Message::Message(&local_260);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_250,
               (AssertionResult *)"fsm.is_in_state<ortho_fsm::on::work>()","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/orthogonal_states_test.cpp"
               ,0x54,pcVar3);
    testing::internal::AssertHelper::operator=(&local_268,&local_260);
    testing::internal::AssertHelper::~AssertHelper(&local_268);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_260);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
  local_299 = detail::
              state_machine_base_impl<afsm::test::ortho_sm_def,_afsm::none,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
              ::is_in_state<afsm::test::ortho_sm_def::on::work::state_a>
                        ((state_machine_base_impl<afsm::test::ortho_sm_def,_afsm::none,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
                          *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_298,&local_299,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
  if (!bVar1) {
    testing::Message::Message(&local_2a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_298,
               (AssertionResult *)"fsm.is_in_state<ortho_fsm::on::work::state_a>()","false","true",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/orthogonal_states_test.cpp"
               ,0x55,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2b0,&local_2a8);
    testing::internal::AssertHelper::~AssertHelper(&local_2b0);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_2a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
  local_2e1 = detail::
              state_machine_base_impl<afsm::test::ortho_sm_def,_afsm::none,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
              ::is_in_state<afsm::test::ortho_sm_def::on::error>
                        ((state_machine_base_impl<afsm::test::ortho_sm_def,_afsm::none,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
                          *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2e0,&local_2e1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e0);
  if (!bVar1) {
    testing::Message::Message(&local_2f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_2e0,
               (AssertionResult *)"fsm.is_in_state<ortho_fsm::on::error>()","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/orthogonal_states_test.cpp"
               ,0x56,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2f8,&local_2f0);
    testing::internal::AssertHelper::~AssertHelper(&local_2f8);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_2f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e0);
  local_329 = detail::
              state_machine_base_impl<afsm::test::ortho_sm_def,_afsm::none,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
              ::is_in_state<afsm::test::ortho_sm_def::on::error::no>
                        ((state_machine_base_impl<afsm::test::ortho_sm_def,_afsm::none,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
                          *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_328,&local_329,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_328);
  if (!bVar1) {
    testing::Message::Message(&local_338);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_328,
               (AssertionResult *)"fsm.is_in_state<ortho_fsm::on::error::no>()","false","true",in_R9
              );
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_340,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/orthogonal_states_test.cpp"
               ,0x57,pcVar3);
    testing::internal::AssertHelper::operator=(&local_340,&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_340);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_338);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
  eVar2 = state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>
          ::process_event<afsm::test::events::do_work>
                    ((state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>
                      *)&gtest_ar_.message_,&local_372);
  local_371 = actions::done(eVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_370,&local_371,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
  if (!bVar1) {
    testing::Message::Message(&local_380);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_370,
               (AssertionResult *)"done(fsm.process_event(events::do_work{}))","false","true",in_R9)
    ;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/orthogonal_states_test.cpp"
               ,0x59,pcVar3);
    testing::internal::AssertHelper::operator=(&local_388,&local_380);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_380);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
  eVar2 = state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>
          ::process_event<afsm::test::events::error>
                    ((state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>
                      *)&gtest_ar_.message_,&local_3ba);
  local_3b9 = actions::done(eVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3b8,&local_3b9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b8);
  if (!bVar1) {
    testing::Message::Message(&local_3c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_3b8,
               (AssertionResult *)"done(fsm.process_event(events::error{}))","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/orthogonal_states_test.cpp"
               ,0x5a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3d0,&local_3c8);
    testing::internal::AssertHelper::~AssertHelper(&local_3d0);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_3c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b8);
  local_401 = detail::
              state_machine_base_impl<afsm::test::ortho_sm_def,_afsm::none,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
              ::is_in_state<afsm::test::ortho_sm_def::on>
                        ((state_machine_base_impl<afsm::test::ortho_sm_def,_afsm::none,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
                          *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_400,&local_401,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_400);
  if (!bVar1) {
    testing::Message::Message(&local_410);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__9.message_,(internal *)local_400,
               (AssertionResult *)"fsm.is_in_state<ortho_fsm::on>()","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_418,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/orthogonal_states_test.cpp"
               ,0x5b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_418,&local_410);
    testing::internal::AssertHelper::~AssertHelper(&local_418);
    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
    testing::Message::~Message(&local_410);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_400);
  local_449 = detail::
              state_machine_base_impl<afsm::test::ortho_sm_def,_afsm::none,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
              ::is_in_state<afsm::test::ortho_sm_def::on::work>
                        ((state_machine_base_impl<afsm::test::ortho_sm_def,_afsm::none,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
                          *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_448,&local_449,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_448);
  if (!bVar1) {
    testing::Message::Message(&local_458);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__10.message_,(internal *)local_448,
               (AssertionResult *)"fsm.is_in_state<ortho_fsm::on::work>()","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_460,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/orthogonal_states_test.cpp"
               ,0x5c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_460,&local_458);
    testing::internal::AssertHelper::~AssertHelper(&local_460);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(&local_458);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_448);
  local_491 = detail::
              state_machine_base_impl<afsm::test::ortho_sm_def,_afsm::none,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
              ::is_in_state<afsm::test::ortho_sm_def::on::work::state_b>
                        ((state_machine_base_impl<afsm::test::ortho_sm_def,_afsm::none,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
                          *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_490,&local_491,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_490);
  if (!bVar1) {
    testing::Message::Message(&local_4a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__11.message_,(internal *)local_490,
               (AssertionResult *)"fsm.is_in_state<ortho_fsm::on::work::state_b>()","false","true",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/orthogonal_states_test.cpp"
               ,0x5d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_4a8,&local_4a0);
    testing::internal::AssertHelper::~AssertHelper(&local_4a8);
    std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
    testing::Message::~Message(&local_4a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_490);
  local_4d9 = detail::
              state_machine_base_impl<afsm::test::ortho_sm_def,_afsm::none,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
              ::is_in_state<afsm::test::ortho_sm_def::on::error>
                        ((state_machine_base_impl<afsm::test::ortho_sm_def,_afsm::none,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
                          *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4d8,&local_4d9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d8);
  if (!bVar1) {
    testing::Message::Message(&local_4e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__12.message_,(internal *)local_4d8,
               (AssertionResult *)"fsm.is_in_state<ortho_fsm::on::error>()","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/orthogonal_states_test.cpp"
               ,0x5e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_4f0,&local_4e8);
    testing::internal::AssertHelper::~AssertHelper(&local_4f0);
    std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
    testing::Message::~Message(&local_4e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d8);
  local_521 = detail::
              state_machine_base_impl<afsm::test::ortho_sm_def,_afsm::none,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
              ::is_in_state<afsm::test::ortho_sm_def::on::error::yes>
                        ((state_machine_base_impl<afsm::test::ortho_sm_def,_afsm::none,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
                          *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_520,&local_521,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_520);
  if (!bVar1) {
    testing::Message::Message(&local_530);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__13.message_,(internal *)local_520,
               (AssertionResult *)"fsm.is_in_state<ortho_fsm::on::error::yes>()","false","true",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_538,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/orthogonal_states_test.cpp"
               ,0x5f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_538,&local_530);
    testing::internal::AssertHelper::~AssertHelper(&local_538);
    std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
    testing::Message::~Message(&local_530);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_520);
  eVar2 = state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>
          ::process_event<afsm::test::events::do_work>
                    ((state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>
                      *)&gtest_ar_.message_,&local_56a);
  local_569 = actions::done(eVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_568,&local_569,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_568);
  if (!bVar1) {
    testing::Message::Message(&local_578);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__14.message_,(internal *)local_568,
               (AssertionResult *)"done(fsm.process_event(events::do_work{}))","false","true",in_R9)
    ;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_580,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/orthogonal_states_test.cpp"
               ,0x61,pcVar3);
    testing::internal::AssertHelper::operator=(&local_580,&local_578);
    testing::internal::AssertHelper::~AssertHelper(&local_580);
    std::__cxx11::string::~string((string *)&gtest_ar__14.message_);
    testing::Message::~Message(&local_578);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_568);
  eVar2 = state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>
          ::process_event<afsm::test::events::error>
                    ((state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>
                      *)&gtest_ar_.message_,&local_5b2);
  local_5b1 = actions::done(eVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5b0,&local_5b1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5b0);
  if (!bVar1) {
    testing::Message::Message(&local_5c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__15.message_,(internal *)local_5b0,
               (AssertionResult *)"done(fsm.process_event(events::error{}))","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_5c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/orthogonal_states_test.cpp"
               ,0x62,pcVar3);
    testing::internal::AssertHelper::operator=(&local_5c8,&local_5c0);
    testing::internal::AssertHelper::~AssertHelper(&local_5c8);
    std::__cxx11::string::~string((string *)&gtest_ar__15.message_);
    testing::Message::~Message(&local_5c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5b0);
  local_5f9 = detail::
              state_machine_base_impl<afsm::test::ortho_sm_def,_afsm::none,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
              ::is_in_state<afsm::test::ortho_sm_def::on>
                        ((state_machine_base_impl<afsm::test::ortho_sm_def,_afsm::none,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
                          *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5f8,&local_5f9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5f8);
  if (!bVar1) {
    testing::Message::Message(&local_608);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__16.message_,(internal *)local_5f8,
               (AssertionResult *)"fsm.is_in_state<ortho_fsm::on>()","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_610,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/orthogonal_states_test.cpp"
               ,99,pcVar3);
    testing::internal::AssertHelper::operator=(&local_610,&local_608);
    testing::internal::AssertHelper::~AssertHelper(&local_610);
    std::__cxx11::string::~string((string *)&gtest_ar__16.message_);
    testing::Message::~Message(&local_608);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5f8);
  local_641 = detail::
              state_machine_base_impl<afsm::test::ortho_sm_def,_afsm::none,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
              ::is_in_state<afsm::test::ortho_sm_def::on::work>
                        ((state_machine_base_impl<afsm::test::ortho_sm_def,_afsm::none,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
                          *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_640,&local_641,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_640);
  if (!bVar1) {
    testing::Message::Message(&local_650);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__17.message_,(internal *)local_640,
               (AssertionResult *)"fsm.is_in_state<ortho_fsm::on::work>()","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/orthogonal_states_test.cpp"
               ,100,pcVar3);
    testing::internal::AssertHelper::operator=(&local_658,&local_650);
    testing::internal::AssertHelper::~AssertHelper(&local_658);
    std::__cxx11::string::~string((string *)&gtest_ar__17.message_);
    testing::Message::~Message(&local_650);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_640);
  local_689 = detail::
              state_machine_base_impl<afsm::test::ortho_sm_def,_afsm::none,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
              ::is_in_state<afsm::test::ortho_sm_def::on::work::state_a>
                        ((state_machine_base_impl<afsm::test::ortho_sm_def,_afsm::none,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
                          *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_688,&local_689,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_688);
  if (!bVar1) {
    testing::Message::Message(&local_698);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__18.message_,(internal *)local_688,
               (AssertionResult *)"fsm.is_in_state<ortho_fsm::on::work::state_a>()","false","true",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_6a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/orthogonal_states_test.cpp"
               ,0x65,pcVar3);
    testing::internal::AssertHelper::operator=(&local_6a0,&local_698);
    testing::internal::AssertHelper::~AssertHelper(&local_6a0);
    std::__cxx11::string::~string((string *)&gtest_ar__18.message_);
    testing::Message::~Message(&local_698);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_688);
  local_6d1 = detail::
              state_machine_base_impl<afsm::test::ortho_sm_def,_afsm::none,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
              ::is_in_state<afsm::test::ortho_sm_def::on::error>
                        ((state_machine_base_impl<afsm::test::ortho_sm_def,_afsm::none,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
                          *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_6d0,&local_6d1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6d0);
  if (!bVar1) {
    testing::Message::Message(&local_6e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__19.message_,(internal *)local_6d0,
               (AssertionResult *)"fsm.is_in_state<ortho_fsm::on::error>()","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_6e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/orthogonal_states_test.cpp"
               ,0x66,pcVar3);
    testing::internal::AssertHelper::operator=(&local_6e8,&local_6e0);
    testing::internal::AssertHelper::~AssertHelper(&local_6e8);
    std::__cxx11::string::~string((string *)&gtest_ar__19.message_);
    testing::Message::~Message(&local_6e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6d0);
  local_719 = detail::
              state_machine_base_impl<afsm::test::ortho_sm_def,_afsm::none,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
              ::is_in_state<afsm::test::ortho_sm_def::on::error::yes>
                        ((state_machine_base_impl<afsm::test::ortho_sm_def,_afsm::none,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
                          *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_718,&local_719,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_718);
  if (!bVar1) {
    testing::Message::Message(&local_728);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_750,(internal *)local_718,
               (AssertionResult *)"fsm.is_in_state<ortho_fsm::on::error::yes>()","false","true",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_730,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/orthogonal_states_test.cpp"
               ,0x67,pcVar3);
    testing::internal::AssertHelper::operator=(&local_730,&local_728);
    testing::internal::AssertHelper::~AssertHelper(&local_730);
    std::__cxx11::string::~string((string *)&local_750);
    testing::Message::~Message(&local_728);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_718);
  state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>::
  ~state_machine((state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>
                  *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(OrthogonalRegions, Simple)
{
    ortho_fsm fsm;
    EXPECT_TRUE(done(fsm.process_event(events::power_on{})));
    EXPECT_TRUE(fsm.is_in_state<ortho_fsm::on>());
    EXPECT_TRUE(fsm.is_in_state<ortho_fsm::on::work>());
    EXPECT_TRUE(fsm.is_in_state<ortho_fsm::on::work::state_a>());
    EXPECT_TRUE(fsm.is_in_state<ortho_fsm::on::error>());
    EXPECT_TRUE(fsm.is_in_state<ortho_fsm::on::error::no>());

    EXPECT_TRUE(done(fsm.process_event(events::do_work{})));
    EXPECT_TRUE(done(fsm.process_event(events::error{})));
    EXPECT_TRUE(fsm.is_in_state<ortho_fsm::on>());
    EXPECT_TRUE(fsm.is_in_state<ortho_fsm::on::work>());
    EXPECT_TRUE(fsm.is_in_state<ortho_fsm::on::work::state_b>());
    EXPECT_TRUE(fsm.is_in_state<ortho_fsm::on::error>());
    EXPECT_TRUE(fsm.is_in_state<ortho_fsm::on::error::yes>());

    EXPECT_TRUE(done(fsm.process_event(events::do_work{})));
    EXPECT_TRUE(done(fsm.process_event(events::error{})));
    EXPECT_TRUE(fsm.is_in_state<ortho_fsm::on>());
    EXPECT_TRUE(fsm.is_in_state<ortho_fsm::on::work>());
    EXPECT_TRUE(fsm.is_in_state<ortho_fsm::on::work::state_a>());
    EXPECT_TRUE(fsm.is_in_state<ortho_fsm::on::error>());
    EXPECT_TRUE(fsm.is_in_state<ortho_fsm::on::error::yes>());
}